

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

void Model<BaseUser>::readFromFile(string *filename)

{
  long *plVar1;
  pair<int,_BaseUser> local_428;
  BaseUser object;
  fstream file;
  
  std::fstream::fstream((string *)&file);
  std::fstream::open((string *)&file,(_Ios_Openmode)filename);
  BaseUser::BaseUser(&object);
  while( true ) {
    plVar1 = (long *)std::istream::read((char *)&file,(long)&object);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    local_428.first = object.super_Model<BaseUser>.id;
    local_428.second.super_Model<BaseUser>.id = object.super_Model<BaseUser>.id;
    local_428.second.super_Model<BaseUser>._vptr_Model = (_func_int **)&PTR_save_0012bc88;
    memcpy(&local_428.second.super_Model<BaseUser>.field_0xc,&object.super_Model<BaseUser>.field_0xc
           ,0xe1);
    std::
    _Rb_tree<int,std::pair<int_const,BaseUser>,std::_Select1st<std::pair<int_const,BaseUser>>,std::less<int>,std::allocator<std::pair<int_const,BaseUser>>>
    ::_M_emplace_unique<std::pair<int,BaseUser>>
              ((_Rb_tree<int,std::pair<int_const,BaseUser>,std::_Select1st<std::pair<int_const,BaseUser>>,std::less<int>,std::allocator<std::pair<int_const,BaseUser>>>
                *)&objectList,&local_428);
  }
  std::fstream::close();
  std::fstream::~fstream(&file);
  return;
}

Assistant:

void Model<T>::readFromFile(const string &filename) {
    fstream file;
    file.open(filename, ios::in | ios::out | ios::binary);
    T object;
    while (file.read((char *) &object, sizeof(object))) {
        Model<T>::objectList.insert(pair<int, T>(object.id, object));
    }
    file.close();
}